

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O0

int to_base64(char *str,size_t str_len,size_t out_len)

{
  void *__ptr;
  int local_4c;
  uint local_48;
  int l;
  int x;
  int n;
  size_t i;
  char *buffer;
  char *b;
  size_t out_len_local;
  size_t str_len_local;
  char *str_local;
  
  l = 0;
  local_48 = 0;
  local_4c = 0;
  __ptr = malloc(((str_len << 2) / 3 + 3 & 0xfffffffffffffffc) + 1);
  if (__ptr == (void *)0x0) {
    if (-1 < msgno) {
      fprintf(_stderr,"password_hash: memory allocate\n");
    }
    str_local._4_4_ = -1;
  }
  else {
    for (_x = 0; _x < str_len; _x = _x + 1) {
      local_48 = local_48 << 8 | (int)str[_x];
      for (local_4c = local_4c + 8; 5 < local_4c; local_4c = local_4c + -6) {
        *(char *)((long)__ptr + (long)l) =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(int)((int)local_48 >> ((char)local_4c - 6U & 0x1f) & 0x3f)];
        l = l + 1;
      }
    }
    if (0 < local_4c) {
      *(char *)((long)__ptr + (long)l) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)(local_48 << (6U - (char)local_4c & 0x1f) & 0x3f)];
      l = l + 1;
    }
    while (l % 4 != 0) {
      *(undefined1 *)((long)__ptr + (long)l) = 0x3d;
      l = l + 1;
    }
    if ((ulong)(long)l < out_len) {
      free(__ptr);
      str_local._4_4_ = -1;
    }
    else {
      for (_x = 0; _x < out_len; _x = _x + 1) {
        if (*(char *)((long)__ptr + _x) == '+') {
          str[_x] = '.';
        }
        else {
          if (*(char *)((long)__ptr + _x) == '=') {
            free(__ptr);
            return -1;
          }
          str[_x] = *(char *)((long)__ptr + _x);
        }
      }
      free(__ptr);
      str_local._4_4_ = (int)_x;
    }
  }
  return str_local._4_4_;
}

Assistant:

static int
to_base64(char *str, size_t str_len, const size_t out_len)
{
    char *b = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    char *buffer;
    size_t i;
    int n = 0, x = 0, l = 0;

    buffer = (char *)malloc(((str_len * 4 / 3 + 3) & ~0x03) + 1);
    if (!buffer) {
        msg_error(hash, "memory allocate\n");
        return -1;
    }

    for (i = 0; i < str_len; i++) {
        x = x << 8 | str[i];
        for (l += 8; l >= 6; l -= 6) {
            buffer[n++] = b[(x >> (l - 6)) & 0x3f];
        }
    }

    if (l > 0) {
        x <<= 6 - l;
        buffer[n++] = b[x & 0x3f];
    }

    for (; n % 4;) {
        buffer[n++] = '=';
    }

    if ((size_t)n < out_len) {
        free(buffer);
        return -1;
    }

    for (i = 0; i < out_len; i++) {
        if (buffer[i] == '+') {
            str[i] = '.';
        } else if (buffer[i] == '=') {
            free(buffer);
            return -1;
        } else {
            str[i] = buffer[i];
        }
    }

    free(buffer);

    return i;
}